

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_atkey_key(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *cclass;
  char *extraout_RDX;
  char *cclass_00;
  char *extraout_RDX_00;
  
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar2 = yymatchClass(G,(uchar *)anon_var_dwarf_3b10,cclass);
  cclass_00 = extraout_RDX;
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar3 = 0;
  }
  else {
    do {
      iVar3 = G->pos;
      iVar1 = G->thunkpos;
      iVar2 = yymatchClass(G,(uchar *)anon_var_dwarf_3b10,cclass_00);
      cclass_00 = extraout_RDX_00;
    } while (iVar2 != 0);
    G->pos = iVar3;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_atkey_key,G->begin,G->pos,"yy_1_atkey_key");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

YY_RULE(int) yy_atkey_key(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "atkey_key"));
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l447;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\277\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>")) goto l447;

  l448:;	
  {  int yypos449= G->pos, yythunkpos449= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\277\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>")) goto l449;
  goto l448;
  l449:;	  G->pos= yypos449; G->thunkpos= yythunkpos449;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l447;  yyDo(G, yy_1_atkey_key, G->begin, G->end, "yy_1_atkey_key");
  yyprintf((stderr, "  ok   atkey_key"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l447:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "atkey_key"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}